

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t send_callback(nghttp2_session *h2,uint8_t *mem,size_t length,int flags,void *userp)

{
  int local_5c;
  nghttp2_session *pnStack_58;
  CURLcode result;
  ssize_t written;
  Curl_easy *data;
  http_conn *c;
  connectdata *conn;
  void *userp_local;
  size_t sStack_28;
  int flags_local;
  size_t length_local;
  uint8_t *mem_local;
  nghttp2_session *h2_local;
  
  data = (Curl_easy *)((long)userp + 0x448);
  c = (http_conn *)userp;
  conn = (connectdata *)userp;
  userp_local._4_4_ = flags;
  sStack_28 = length;
  length_local = (size_t)mem;
  mem_local = (uint8_t *)h2;
  written = (ssize_t)get_transfer((http_conn *)data);
  local_5c = 0;
  if ((data->msg).list.next == (Curl_llist_element *)0x0) {
    h2_local = (nghttp2_session *)0xfffffffffffffc7a;
  }
  else {
    pnStack_58 = (nghttp2_session *)
                 (*(code *)(data->msg).list.next)(written,0,length_local,sStack_28,&local_5c);
    if (local_5c == 0x51) {
      h2_local = (nghttp2_session *)0xfffffffffffffe08;
    }
    else if (pnStack_58 == (nghttp2_session *)0xffffffffffffffff) {
      Curl_failf((Curl_easy *)written,"Failed sending HTTP2 data");
      h2_local = (nghttp2_session *)0xfffffffffffffc7a;
    }
    else {
      h2_local = pnStack_58;
      if (pnStack_58 == (nghttp2_session *)0x0) {
        h2_local = (nghttp2_session *)0xfffffffffffffe08;
      }
    }
  }
  return (ssize_t)h2_local;
}

Assistant:

static ssize_t send_callback(nghttp2_session *h2,
                             const uint8_t *mem, size_t length, int flags,
                             void *userp)
{
  struct connectdata *conn = (struct connectdata *)userp;
  struct http_conn *c = &conn->proto.httpc;
  struct Curl_easy *data = get_transfer(c);
  ssize_t written;
  CURLcode result = CURLE_OK;

  (void)h2;
  (void)flags;

  if(!c->send_underlying)
    /* called before setup properly! */
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  written = ((Curl_send*)c->send_underlying)(data, FIRSTSOCKET,
                                             mem, length, &result);

  if(result == CURLE_AGAIN) {
    return NGHTTP2_ERR_WOULDBLOCK;
  }

  if(written == -1) {
    failf(data, "Failed sending HTTP2 data");
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  if(!written)
    return NGHTTP2_ERR_WOULDBLOCK;

  return written;
}